

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

ExtPubkey * __thiscall
cfd::core::ExtPubkey::DerivePubkey
          (ExtPubkey *__return_storage_ptr__,ExtPubkey *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path)

{
  bool bVar1;
  uchar *puVar2;
  size_type sVar3;
  CfdException *pCVar4;
  uint *child_path;
  ByteData local_3a0;
  ByteData256 local_388;
  allocator<unsigned_char> local_369;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_368 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_sum;
  ByteData256 tweak_sum_data;
  string local_330;
  CfdSourceLocation local_310;
  allocator<unsigned_char> local_2f1;
  undefined1 local_2f0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string local_2d0;
  CfdSourceLocation local_2b0;
  undefined1 local_292;
  allocator local_291;
  string local_290;
  CfdSourceLocation local_270;
  reference local_258;
  uint *value;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  undefined1 local_230 [4];
  uint32_t flag;
  undefined1 local_212;
  allocator local_211;
  string local_210;
  CfdSourceLocation local_1f0;
  int local_1c4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c0 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *serialize_data;
  ext_key child_key;
  ext_key extkey;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *path_local;
  ExtPubkey *this_local;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0,
                     &this->serialize_data_);
  local_1a8 = local_1c0;
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_1c0);
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_1a8);
  local_1c4 = bip32_key_unserialize(puVar2,sVar3,(ext_key *)(child_key.pub_key_tweak_sum + 0x18));
  if (local_1c4 != 0) {
    local_1f0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_1f0.filename = local_1f0.filename + 1;
    local_1f0.line = 0x3cd;
    local_1f0.funcname = "DerivePubkey";
    logger::warn<int&>(&local_1f0,"bip32_key_unserialize error. ret={}",&local_1c4);
    local_212 = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_210,"ExtPubkey unserialize error.",&local_211);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_210);
    local_212 = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_230,&this->tweak_sum_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_230);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_230);
  child_path = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(path);
  sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(path);
  local_1c4 = bip32_key_from_parent_path
                        ((ext_key *)(child_key.pub_key_tweak_sum + 0x18),child_path,sVar3,5,
                         (ext_key *)&serialize_data);
  if (local_1c4 != 0) {
    __end3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(path);
    value = (uint *)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(path);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  *)&value);
      if (!bVar1) {
        local_2b0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                     ,0x2f);
        local_2b0.filename = local_2b0.filename + 1;
        local_2b0.line = 1000;
        local_2b0.funcname = "DerivePubkey";
        logger::warn<int&>(&local_2b0,"bip32_key_from_parent_path error. ret={}",&local_1c4);
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_2d0,"ExtPubkey derive error.",
                   (allocator *)
                   ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_2d0);
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_258 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&__end3);
      if ((*local_258 & 0x80000000) != 0) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end3);
    }
    local_270.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_270.filename = local_270.filename + 1;
    local_270.line = 0x3e1;
    local_270.funcname = "DerivePubkey";
    logger::warn<int&>(&local_270,"bip32_key_from_parent_path error. ret={} hardened=true",
                       &local_1c4);
    local_292 = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_290,"ExtPubkey hardened derive error.",&local_291);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_290);
    local_292 = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::allocator<unsigned_char>::allocator(&local_2f1);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2f0,0x4e,&local_2f1);
  ::std::allocator<unsigned_char>::~allocator(&local_2f1);
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2f0);
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2f0);
  local_1c4 = bip32_key_serialize((ext_key *)&serialize_data,1,puVar2,sVar3);
  if (local_1c4 != 0) {
    local_310.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_310.filename = local_310.filename + 1;
    local_310.line = 0x3f0;
    local_310.funcname = "DerivePubkey";
    logger::warn<int&>(&local_310,"bip32_key_serialize error. ret={}",&local_1c4);
    tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_330,"ExtPubkey serialize error.",
               (allocator *)
               ((long)&tweak_sum_data.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_330);
    tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData256::ByteData256
            ((ByteData256 *)
             &tweak_sum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::allocator<unsigned_char>::allocator(&local_369);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_368,0x20,&local_369);
  ::std::allocator<unsigned_char>::~allocator(&local_369);
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_368);
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_368);
  memcpy(puVar2,child_key.pub_key + 0x19,sVar3);
  ByteData256::ByteData256
            (&local_388,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_368);
  ByteData256::operator=
            ((ByteData256 *)
             &tweak_sum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_388);
  ByteData256::~ByteData256(&local_388);
  ByteData::ByteData(&local_3a0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2f0);
  ExtPubkey(__return_storage_ptr__,&local_3a0,
            (ByteData256 *)
            &tweak_sum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData(&local_3a0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_368);
  ByteData256::~ByteData256
            ((ByteData256 *)
             &tweak_sum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2f0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey ExtPubkey::DerivePubkey(const std::vector<uint32_t>& path) const {
  struct ext_key extkey;
  struct ext_key child_key;

  const std::vector<uint8_t>& serialize_data = serialize_data_.GetBytes();
  int ret = bip32_key_unserialize(
      serialize_data.data(), serialize_data.size(), &extkey);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_unserialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPubkey unserialize error.");
  }

#ifndef CFD_DISABLE_ELEMENTS
  // write pub_key_tweak_sum to ext_key
  memcpy(
      extkey.pub_key_tweak_sum, tweak_sum_.GetBytes().data(),
      sizeof(extkey.pub_key_tweak_sum));
#endif  // CFD_DISABLE_ELEMENTS
  uint32_t flag = BIP32_FLAG_KEY_PUBLIC;
  ret = bip32_key_from_parent_path(
      &extkey, path.data(), path.size(), flag | BIP32_FLAG_KEY_TWEAK_SUM,
      &child_key);
  if (ret != WALLY_OK) {
    // hardened check
    for (const auto& value : path) {
      if ((value & ExtPrivkey::kHardenedKey) != 0) {
        warn(
            CFD_LOG_SOURCE,
            "bip32_key_from_parent_path error. ret={} hardened=true", ret);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "ExtPubkey hardened derive error.");
      }
    }
    warn(CFD_LOG_SOURCE, "bip32_key_from_parent_path error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPubkey derive error.");
  }

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  ret = bip32_key_serialize(&child_key, flag, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPubkey serialize error.");
  }

  ByteData256 tweak_sum_data;
#ifndef CFD_DISABLE_ELEMENTS
  // collect pub_key_tweak_sum from ext_key
  std::vector<uint8_t> tweak_sum(sizeof(child_key.pub_key_tweak_sum));
  memcpy(tweak_sum.data(), child_key.pub_key_tweak_sum, tweak_sum.size());
  tweak_sum_data = ByteData256(tweak_sum);
#endif  // CFD_DISABLE_ELEMENTS
  return ExtPubkey(ByteData(data), tweak_sum_data);
}